

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall CVmRun::compute_sum(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined8 in_RDX;
  undefined4 *in_RSI;
  char *unaff_retaddr;
  vm_obj_id_t in_stack_0000000c;
  vm_val_t *in_stack_00000010;
  vm_val_t *in_stack_00000080;
  vm_val_t *in_stack_00000088;
  vm_val_t *in_stack_00000090;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
LAB_0022e813:
  switch(*in_RSI) {
  case 5:
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0x22])(pCVar2,in_RSI,(ulong)(uint)in_RSI[2],in_RDX);
    return iVar1;
  default:
    return 0;
  case 7:
    break;
  case 8:
    CVmObjString::add_to_str(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    return 1;
  case 10:
    get_const_ptr(0);
    CVmObjList::add_to_list
              (in_stack_00000010,in_stack_0000000c,unaff_retaddr,
               (vm_val_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    return 1;
  }
  iVar1 = vm_val_t::is_numeric(in_stack_ffffffffffffffd0);
  if (iVar1 == 0) {
    err_throw(0);
  }
  vm_val_t::promote_int(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  goto LAB_0022e813;
}

Assistant:

int CVmRun::compute_sum(VMG_ vm_val_t *val1, const vm_val_t *val2)
{
    /* the meaning of "add" depends on the type of the first operand */
check_type:
    switch(val1->typ)
    {
    case VM_SSTRING:
        /* 
         *   string constant - add the second value to the string, using
         *   the static string add method 
         */
        CVmObjString::add_to_str(vmg_ val1, val1, val2);
        return TRUE;

    case VM_LIST:
        /* 
         *   list constant - add the second value to the list, using the
         *   static list add method 
         */
        CVmObjList::add_to_list(vmg_ val1, VM_INVALID_OBJ,
                                get_const_ptr(vmg_ val1->val.ofs), val2);
        return TRUE;

    case VM_OBJ:
        /*
         *   object - add the second value to the object, using the
         *   object's virtual metaclass add method 
         */
        return vm_objp(vmg_ val1->val.obj)->add_val(
            vmg_ val1, val1->val.obj, val2);

    case VM_INT:
        /* 
         *   callers handle the int+int case inline, so we can skip that; we
         *   just need to check for other numeric types
         */
        if (val2->is_numeric(vmg0_))
        {
            /* 
             *   the other value is numeric but not an integer; promote the
             *   integer to the other type, then re-do the type check
             */
            val2->promote_int(vmg_ val1);
            goto check_type;
        }
        else
        {
            /* can't add a non-numeric value to an integer */
            err_throw(VMERR_NUM_VAL_REQD);
            AFTER_ERR_THROW(return FALSE;)
        }

    default:
        /* other types don't understand '+' as a native operator */
        return FALSE;
    }
}